

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

CharCount UnifiedRegex::MatchCharNode::FindUniqueEquivs(Char *equivs,Char *uniqueEquivs)

{
  bool bVar1;
  uint local_28;
  CharCount uniqueIndex;
  uint uStack_1c;
  bool alreadyHave;
  CharCount equivIndex;
  CharCount uniqueCount;
  Char *uniqueEquivs_local;
  Char *equivs_local;
  
  *uniqueEquivs = *equivs;
  uStack_1c = 1;
  uniqueIndex = 1;
  do {
    if (3 < uniqueIndex) {
      return uStack_1c;
    }
    bVar1 = false;
    for (local_28 = 0; local_28 < uStack_1c; local_28 = local_28 + 1) {
      if (uniqueEquivs[local_28] == equivs[uniqueIndex]) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      uniqueEquivs[uStack_1c] = equivs[uniqueIndex];
      uStack_1c = uStack_1c + 1;
    }
    uniqueIndex = uniqueIndex + 1;
  } while( true );
}

Assistant:

CharCount MatchCharNode::FindUniqueEquivs(const Char equivs[CaseInsensitive::EquivClassSize], __out_ecount(4) Char uniqueEquivs[CaseInsensitive::EquivClassSize])
    {
        uniqueEquivs[0] = equivs[0];
        CharCount uniqueCount = 1;
        for (CharCount equivIndex = 1; equivIndex < CaseInsensitive::EquivClassSize; ++equivIndex)
        {
            bool alreadyHave = false;
            for (CharCount uniqueIndex = 0; uniqueIndex < uniqueCount; ++uniqueIndex)
            {
                if (uniqueEquivs[uniqueIndex] == equivs[equivIndex])
                {
                    alreadyHave = true;
                    break;
                }
            }

            if (!alreadyHave)
            {
                uniqueEquivs[uniqueCount] = equivs[equivIndex];
                uniqueCount += 1;
            }
        }

        return uniqueCount;
    }